

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  Expr *p;
  bool bVar1;
  int iVar2;
  ExprList *pEVar3;
  Expr *extraout_RDX;
  Expr *extraout_RDX_00;
  Expr *extraout_RDX_01;
  Expr *extraout_RDX_02;
  int iVar4;
  ExprList_item *pEVar5;
  ExprList_item *pEVar6;
  long lVar7;
  long lVar8;
  ExprList *pOrderBy_00;
  int iCol;
  int local_58;
  uint local_54;
  Parse *local_50;
  ExprList *local_48;
  char *local_40;
  NameContext *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_50 = pNC->pParse;
  pOrderBy_00 = pOrderBy;
  local_38 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_54 = pSelect->pEList->nExpr;
    pEVar5 = pOrderBy->a;
    iVar4 = 0;
    local_48 = pOrderBy;
    local_40 = zType;
    do {
      pExpr = pEVar5->pExpr;
      p = pExpr;
      while ((p != (Expr *)0x0 && ((p->flags >> 0xc & 1) != 0))) {
        if ((p->flags >> 0x12 & 1) == 0) {
          pEVar6 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar6 = ((p->x).pList)->a;
        }
        p = pEVar6->pExpr;
      }
      if ((*zType == 'G') ||
         (local_58 = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,(Expr *)pOrderBy),
         local_58 < 1)) {
        iVar2 = sqlite3ExprIsInteger(p,&local_58);
        if (iVar2 == 0) {
          (pEVar5->u).x.iOrderByCol = 0;
          iVar2 = sqlite3ResolveExprNames(local_38,pExpr);
          bVar1 = true;
          pOrderBy = (ExprList *)extraout_RDX_01;
          if (iVar2 == 0) {
            pEVar3 = pSelect->pEList;
            bVar1 = false;
            if (0 < pEVar3->nExpr) {
              lVar7 = 8;
              lVar8 = 0;
              do {
                iVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,
                                           *(Expr **)((long)pEVar3->a + lVar7 + -8),-1);
                if (iVar2 == 0) {
                  (pEVar5->u).x.iOrderByCol = (short)lVar8 + 1;
                }
                lVar8 = lVar8 + 1;
                pEVar3 = pSelect->pEList;
                lVar7 = lVar7 + 0x20;
                pOrderBy = (ExprList *)extraout_RDX_02;
                zType = local_40;
                pOrderBy_00 = local_48;
              } while (lVar8 < pEVar3->nExpr);
            }
          }
        }
        else {
          pOrderBy = (ExprList *)0xffff0000;
          if (0xffff0000 < local_58 - 0x10000U) {
            (pEVar5->u).x.iOrderByCol = (u16)local_58;
            goto LAB_00162cab;
          }
          sqlite3ErrorMsg(local_50,"%r %s BY term out of range - should be between 1 and %d",
                          (ulong)(iVar4 + 1),zType,(ulong)local_54);
          bVar1 = true;
          pOrderBy = (ExprList *)extraout_RDX_00;
        }
      }
      else {
        (pEVar5->u).x.iOrderByCol = (u16)local_58;
        pOrderBy = (ExprList *)extraout_RDX;
LAB_00162cab:
        bVar1 = false;
      }
      if (bVar1) {
        return 1;
      }
      iVar4 = iVar4 + 1;
      pEVar5 = pEVar5 + 1;
    } while (iVar4 < pOrderBy_00->nExpr);
  }
  iVar4 = sqlite3ResolveOrderGroupBy(local_50,pSelect,pOrderBy_00,zType);
  return iVar4;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}